

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 auVar67 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar63 [64];
  undefined1 auVar68 [64];
  
  auVar54._4_60_ = in_register_00001204;
  auVar54._0_4_ = scale;
  fVar10 = scale * r_scale0;
  pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar8 = pBVar7[itime].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[itime].super_RawBufferView.stride;
  lVar40 = (uVar5 + 1) * sVar9;
  lVar39 = (uVar5 + 2) * sVar9;
  lVar38 = (uVar5 + 3) * sVar9;
  aVar4 = ofs->field_0;
  auVar49 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + uVar5 * sVar9),(undefined1  [16])aVar4);
  auVar42 = vshufps_avx(auVar54._0_16_,auVar54._0_16_,0);
  fVar71 = auVar42._0_4_;
  auVar41._0_4_ = fVar71 * auVar49._0_4_;
  fVar74 = auVar42._4_4_;
  auVar41._4_4_ = fVar74 * auVar49._4_4_;
  fVar75 = auVar42._8_4_;
  auVar41._8_4_ = fVar75 * auVar49._8_4_;
  fVar76 = auVar42._12_4_;
  auVar41._12_4_ = fVar76 * auVar49._12_4_;
  auVar42 = vshufps_avx(auVar41,auVar41,0);
  auVar49 = vshufps_avx(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  fVar13 = (space->vx).field_0.m128[0];
  fVar16 = (space->vx).field_0.m128[1];
  fVar17 = (space->vx).field_0.m128[2];
  fVar18 = (space->vx).field_0.m128[3];
  fVar19 = (space->vy).field_0.m128[0];
  fVar20 = (space->vy).field_0.m128[1];
  fVar21 = (space->vy).field_0.m128[2];
  fVar22 = (space->vy).field_0.m128[3];
  fVar23 = (space->vz).field_0.m128[0];
  fVar24 = (space->vz).field_0.m128[1];
  fVar25 = (space->vz).field_0.m128[2];
  fVar26 = (space->vz).field_0.m128[3];
  auVar46._0_4_ = fVar13 * auVar42._0_4_ + fVar19 * auVar49._0_4_ + fVar23 * auVar41._0_4_;
  auVar46._4_4_ = fVar16 * auVar42._4_4_ + fVar20 * auVar49._4_4_ + fVar24 * auVar41._4_4_;
  auVar46._8_4_ = fVar17 * auVar42._8_4_ + fVar21 * auVar49._8_4_ + fVar25 * auVar41._8_4_;
  auVar46._12_4_ = fVar18 * auVar42._12_4_ + fVar22 * auVar49._12_4_ + fVar26 * auVar41._12_4_;
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  auVar42 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar40),(undefined1  [16])aVar4);
  auVar50._0_4_ = fVar71 * auVar42._0_4_;
  auVar50._4_4_ = fVar74 * auVar42._4_4_;
  auVar50._8_4_ = fVar75 * auVar42._8_4_;
  auVar50._12_4_ = fVar76 * auVar42._12_4_;
  auVar42 = vshufps_avx(auVar50,auVar50,0);
  auVar49 = vshufps_avx(auVar50,auVar50,0x55);
  auVar41 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar55._0_4_ = fVar13 * auVar42._0_4_ + fVar19 * auVar49._0_4_ + fVar23 * auVar41._0_4_;
  auVar55._4_4_ = fVar16 * auVar42._4_4_ + fVar20 * auVar49._4_4_ + fVar24 * auVar41._4_4_;
  auVar55._8_4_ = fVar17 * auVar42._8_4_ + fVar21 * auVar49._8_4_ + fVar25 * auVar41._8_4_;
  auVar55._12_4_ = fVar18 * auVar42._12_4_ + fVar22 * auVar49._12_4_ + fVar26 * auVar41._12_4_;
  fVar11 = fVar10 * fVar3 * *(float *)(pcVar8 + lVar40 + 0xc);
  auVar54 = ZEXT464((uint)fVar11);
  auVar42 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar39),(undefined1  [16])aVar4);
  auVar57._0_4_ = fVar71 * auVar42._0_4_;
  auVar57._4_4_ = fVar74 * auVar42._4_4_;
  auVar57._8_4_ = fVar75 * auVar42._8_4_;
  auVar57._12_4_ = fVar76 * auVar42._12_4_;
  auVar42 = vshufps_avx(auVar57,auVar57,0);
  auVar49 = vshufps_avx(auVar57,auVar57,0x55);
  auVar41 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar60._0_4_ = fVar13 * auVar42._0_4_ + fVar19 * auVar49._0_4_ + fVar23 * auVar41._0_4_;
  auVar60._4_4_ = fVar16 * auVar42._4_4_ + fVar20 * auVar49._4_4_ + fVar24 * auVar41._4_4_;
  auVar60._8_4_ = fVar17 * auVar42._8_4_ + fVar21 * auVar49._8_4_ + fVar25 * auVar41._8_4_;
  auVar60._12_4_ = fVar18 * auVar42._12_4_ + fVar22 * auVar49._12_4_ + fVar26 * auVar41._12_4_;
  auVar63 = ZEXT1664(auVar60);
  fVar12 = fVar10 * fVar3 * *(float *)(pcVar8 + lVar39 + 0xc);
  auVar59 = ZEXT464((uint)fVar12);
  auVar42 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar38),(undefined1  [16])aVar4);
  auVar64._0_4_ = fVar71 * auVar42._0_4_;
  auVar64._4_4_ = fVar74 * auVar42._4_4_;
  auVar64._8_4_ = fVar75 * auVar42._8_4_;
  auVar64._12_4_ = fVar76 * auVar42._12_4_;
  auVar42 = vshufps_avx(auVar64,auVar64,0);
  auVar49 = vshufps_avx(auVar64,auVar64,0x55);
  auVar41 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar65._0_4_ = auVar42._0_4_ * fVar13 + fVar19 * auVar49._0_4_ + fVar23 * auVar41._0_4_;
  auVar65._4_4_ = auVar42._4_4_ * fVar16 + fVar20 * auVar49._4_4_ + fVar24 * auVar41._4_4_;
  auVar65._8_4_ = auVar42._8_4_ * fVar17 + fVar21 * auVar49._8_4_ + fVar25 * auVar41._8_4_;
  auVar65._12_4_ = auVar42._12_4_ * fVar18 + fVar22 * auVar49._12_4_ + fVar26 * auVar41._12_4_;
  auVar68 = ZEXT1664(auVar65);
  fVar13 = fVar3 * *(float *)(pcVar8 + lVar38 + 0xc) * fVar10;
  uVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar36 = (ulong)uVar6;
  auVar49 = ZEXT416((uint)fVar12);
  auVar42 = ZEXT416((uint)(fVar10 * fVar3 * *(float *)(pcVar8 + uVar5 * sVar9 + 0xc)));
  if (uVar36 == 4) {
    auVar50 = vshufps_avx(auVar65,auVar65,0);
    auVar57 = vshufps_avx(auVar65,auVar65,0x55);
    auVar64 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar65 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    auVar45 = vshufps_avx(auVar60,auVar60,0);
    auVar43 = vshufps_avx(auVar60,auVar60,0x55);
    auVar41 = vinsertps_avx(auVar60,ZEXT416((uint)fVar12),0x30);
    auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
    auVar48 = vshufps_avx(ZEXT416((uint)fVar12),auVar49,0);
    auVar49 = vshufps_avx(auVar55,auVar55,0);
    auVar47 = vshufps_avx(auVar55,auVar55,0x55);
    auVar55 = vshufps_avx(auVar55,auVar55,0xaa);
    auVar51 = vshufps_avx(auVar46,auVar46,0);
    auVar14 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
    auVar15 = vshufps_avx(auVar46,auVar46,0x55);
    auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar61._0_4_ =
         auVar49._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar50._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar45._0_4_ +
         (float)catmullrom_basis0._272_4_ * auVar51._0_4_;
    auVar61._4_4_ =
         auVar49._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar50._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar45._4_4_ +
         (float)catmullrom_basis0._276_4_ * auVar51._4_4_;
    auVar61._8_4_ =
         auVar49._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar50._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar45._8_4_ +
         (float)catmullrom_basis0._280_4_ * auVar51._8_4_;
    auVar61._12_4_ =
         auVar49._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar50._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar45._12_4_ +
         (float)catmullrom_basis0._284_4_ * auVar51._12_4_;
    auVar66._0_4_ =
         auVar47._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar57._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar43._0_4_ +
         (float)catmullrom_basis0._272_4_ * auVar15._0_4_;
    auVar66._4_4_ =
         auVar47._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar57._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar43._4_4_ +
         (float)catmullrom_basis0._276_4_ * auVar15._4_4_;
    auVar66._8_4_ =
         auVar47._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar57._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar43._8_4_ +
         (float)catmullrom_basis0._280_4_ * auVar15._8_4_;
    auVar66._12_4_ =
         auVar47._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar57._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar43._12_4_ +
         (float)catmullrom_basis0._284_4_ * auVar15._12_4_;
    auVar47._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar46._0_4_ +
         auVar55._0_4_ * (float)catmullrom_basis0._1428_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar60._0_4_ +
         auVar64._0_4_ * (float)catmullrom_basis0._3740_4_;
    auVar47._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar46._4_4_ +
         auVar55._4_4_ * (float)catmullrom_basis0._1432_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar60._4_4_ +
         auVar64._4_4_ * (float)catmullrom_basis0._3744_4_;
    auVar47._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar46._8_4_ +
         auVar55._8_4_ * (float)catmullrom_basis0._1436_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar60._8_4_ +
         auVar64._8_4_ * (float)catmullrom_basis0._3748_4_;
    auVar47._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar46._12_4_ +
         auVar55._12_4_ * (float)catmullrom_basis0._1440_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar60._12_4_ +
         auVar64._12_4_ * (float)catmullrom_basis0._3752_4_;
    auVar43._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar42._0_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar48._0_4_ +
         auVar65._0_4_ * (float)catmullrom_basis0._3740_4_ +
         auVar14._0_4_ * (float)catmullrom_basis0._1428_4_;
    auVar43._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar42._4_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar48._4_4_ +
         auVar65._4_4_ * (float)catmullrom_basis0._3744_4_ +
         auVar14._4_4_ * (float)catmullrom_basis0._1432_4_;
    auVar43._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar42._8_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar48._8_4_ +
         auVar65._8_4_ * (float)catmullrom_basis0._3748_4_ +
         auVar14._8_4_ * (float)catmullrom_basis0._1436_4_;
    auVar43._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar42._12_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar48._12_4_ +
         auVar65._12_4_ * (float)catmullrom_basis0._3752_4_ +
         auVar14._12_4_ * (float)catmullrom_basis0._1440_4_;
    auVar50 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar42 = vminps_avx(auVar50,auVar61);
    auVar49 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vminps_avx(auVar49,auVar42);
    auVar55 = vshufps_avx(auVar66,auVar66,0xb1);
    auVar49 = vminps_avx(auVar55,auVar66);
    auVar46 = vshufpd_avx(auVar49,auVar49,1);
    auVar49 = vminps_avx(auVar46,auVar49);
    auVar42 = vinsertps_avx(auVar42,auVar49,0x1c);
    auVar57 = vshufps_avx(auVar47,auVar47,0xb1);
    auVar49 = vminps_avx(auVar57,auVar47);
    auVar46 = vshufpd_avx(auVar49,auVar49,1);
    auVar49 = vminps_avx(auVar46,auVar49);
    auVar49 = vinsertps_avx(auVar42,auVar49,0x20);
    auVar42 = vmaxps_avx(auVar50,auVar61);
    auVar46 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vmaxps_avx(auVar46,auVar42);
    auVar46 = vmaxps_avx(auVar55,auVar66);
    auVar50 = vshufpd_avx(auVar46,auVar46,1);
    auVar46 = vmaxps_avx(auVar50,auVar46);
    auVar42 = vinsertps_avx(auVar42,auVar46,0x1c);
    auVar46 = vmaxps_avx(auVar57,auVar47);
    auVar50 = vshufpd_avx(auVar46,auVar46,1);
    auVar46 = vmaxps_avx(auVar50,auVar46);
    auVar46 = vinsertps_avx(auVar42,auVar46,0x20);
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx(auVar43,auVar51);
    auVar50 = vshufps_avx(auVar42,auVar42,0xb1);
    auVar42 = vmaxps_avx(auVar50,auVar42);
    auVar50 = vshufps_avx(auVar42,auVar42,0);
    auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
    auVar50 = vmaxps_avx(auVar42,auVar50);
    auVar55 = vminps_avx(auVar49,auVar41);
    auVar49 = vmaxps_avx(auVar46,auVar41);
    auVar42 = vandps_avx(auVar48,auVar51);
    auVar41 = vmaxps_avx(auVar50,auVar42);
    auVar42 = vsubps_avx(auVar55,auVar41);
    auVar45._0_4_ = auVar49._0_4_ + auVar41._0_4_;
    auVar45._4_4_ = auVar49._4_4_ + auVar41._4_4_;
    auVar45._8_4_ = auVar49._8_4_ + auVar41._8_4_;
    auVar45._12_4_ = auVar49._12_4_ + auVar41._12_4_;
  }
  else {
    if ((int)uVar6 < 0) {
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      auVar70._16_4_ = 0x7f800000;
      auVar70._20_4_ = 0x7f800000;
      auVar70._24_4_ = 0x7f800000;
      auVar70._28_4_ = 0x7f800000;
      auVar79._8_4_ = 0xff800000;
      auVar79._0_8_ = 0xff800000ff800000;
      auVar79._12_4_ = 0xff800000;
      auVar79._16_4_ = 0xff800000;
      auVar79._20_4_ = 0xff800000;
      auVar79._24_4_ = 0xff800000;
      auVar79._28_4_ = 0xff800000;
      auVar53 = ZEXT832(0);
      auVar72 = auVar70;
      auVar73 = auVar70;
      auVar77 = auVar79;
      auVar56 = auVar79;
    }
    else {
      auVar41 = vpshufd_avx(ZEXT416(uVar6),0);
      auVar50 = vshufps_avx(auVar46,auVar46,0);
      auVar57 = vshufps_avx(auVar46,auVar46,0x55);
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      auVar64 = vshufps_avx(auVar55,auVar55,0);
      auVar45 = vshufps_avx(auVar55,auVar55,0x55);
      auVar55 = vshufps_avx(auVar55,auVar55,0xaa);
      auVar43 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
      auVar48 = vshufps_avx(auVar60,auVar60,0);
      auVar47 = vshufps_avx(auVar60,auVar60,0x55);
      auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
      auVar49 = vshufps_avx(auVar49,auVar49,0);
      auVar51 = vshufps_avx(auVar65,auVar65,0);
      auVar14 = vshufps_avx(auVar65,auVar65,0x55);
      auVar65 = vshufps_avx(auVar65,auVar65,0xaa);
      auVar15 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
      lVar38 = uVar36 * 0x44;
      uVar37 = 0;
      auVar44 = ZEXT864(0) << 0x20;
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      auVar56._16_4_ = 0xff800000;
      auVar56._20_4_ = 0xff800000;
      auVar56._24_4_ = 0xff800000;
      auVar56._28_4_ = 0xff800000;
      auVar72._8_4_ = 0x7f800000;
      auVar72._0_8_ = 0x7f8000007f800000;
      auVar72._12_4_ = 0x7f800000;
      auVar72._16_4_ = 0x7f800000;
      auVar72._20_4_ = 0x7f800000;
      auVar72._24_4_ = 0x7f800000;
      auVar72._28_4_ = 0x7f800000;
      auVar70 = auVar72;
      auVar73 = auVar72;
      auVar77 = auVar56;
      auVar79 = auVar56;
      do {
        auVar66 = vpshufd_avx(ZEXT416((uint)uVar37),0);
        auVar61 = vpor_avx(auVar66,_DAT_01f7fcf0);
        auVar66 = vpor_avx(auVar66,_DAT_01fafea0);
        auVar61 = vpcmpgtd_avx(auVar61,auVar41);
        auVar66 = vpcmpgtd_avx(auVar66,auVar41);
        auVar78._16_16_ = auVar66;
        auVar78._0_16_ = auVar61;
        pfVar1 = (float *)(lVar38 + 0x21b3c74 + uVar37 * 4);
        fVar3 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        fVar13 = pfVar1[4];
        fVar16 = pfVar1[5];
        fVar17 = pfVar1[6];
        pfVar2 = (float *)(lVar38 + 0x21b40f8 + uVar37 * 4);
        fVar18 = *pfVar2;
        fVar19 = pfVar2[1];
        fVar20 = pfVar2[2];
        fVar21 = pfVar2[3];
        fVar22 = pfVar2[4];
        fVar23 = pfVar2[5];
        fVar24 = pfVar2[6];
        fVar25 = pfVar2[7];
        local_1a8 = auVar51._0_4_;
        fStack_1a4 = auVar51._4_4_;
        fStack_1a0 = auVar51._8_4_;
        fStack_19c = auVar51._12_4_;
        local_1c8 = auVar14._0_4_;
        fStack_1c4 = auVar14._4_4_;
        fStack_1c0 = auVar14._8_4_;
        fStack_1bc = auVar14._12_4_;
        local_1e8 = auVar65._0_4_;
        fStack_1e4 = auVar65._4_4_;
        fStack_1e0 = auVar65._8_4_;
        fStack_1dc = auVar65._12_4_;
        local_128 = auVar48._0_4_;
        fStack_124 = auVar48._4_4_;
        fStack_120 = auVar48._8_4_;
        fStack_11c = auVar48._12_4_;
        fVar69 = auVar68._28_4_;
        local_148 = auVar47._0_4_;
        fStack_144 = auVar47._4_4_;
        fStack_140 = auVar47._8_4_;
        fStack_13c = auVar47._12_4_;
        local_168 = auVar60._0_4_;
        fStack_164 = auVar60._4_4_;
        fStack_160 = auVar60._8_4_;
        fStack_15c = auVar60._12_4_;
        pfVar2 = (float *)(lVar38 + 0x21b37f0 + uVar37 * 4);
        fVar26 = *pfVar2;
        fVar71 = pfVar2[1];
        fVar74 = pfVar2[2];
        fVar75 = pfVar2[3];
        fVar76 = pfVar2[4];
        fVar27 = pfVar2[5];
        fVar28 = pfVar2[6];
        local_188 = auVar49._0_4_;
        fStack_184 = auVar49._4_4_;
        fStack_180 = auVar49._8_4_;
        fStack_17c = auVar49._12_4_;
        fVar80 = pfVar1[7] + fVar25;
        local_a8 = auVar64._0_4_;
        fStack_a4 = auVar64._4_4_;
        fStack_a0 = auVar64._8_4_;
        fStack_9c = auVar64._12_4_;
        local_c8 = auVar45._0_4_;
        fStack_c4 = auVar45._4_4_;
        fStack_c0 = auVar45._8_4_;
        fStack_bc = auVar45._12_4_;
        local_e8 = auVar55._0_4_;
        fStack_e4 = auVar55._4_4_;
        fStack_e0 = auVar55._8_4_;
        fStack_dc = auVar55._12_4_;
        pfVar1 = (float *)(catmullrom_basis0 + uVar37 * 4 + lVar38);
        fVar29 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar31 = pfVar1[2];
        fVar32 = pfVar1[3];
        fVar33 = pfVar1[4];
        fVar34 = pfVar1[5];
        fVar35 = pfVar1[6];
        local_108 = auVar43._0_4_;
        fStack_104 = auVar43._4_4_;
        fStack_100 = auVar43._8_4_;
        fStack_fc = auVar43._12_4_;
        local_28 = auVar50._0_4_;
        fStack_24 = auVar50._4_4_;
        fStack_20 = auVar50._8_4_;
        fStack_1c = auVar50._12_4_;
        auVar52._0_4_ =
             fVar29 * local_28 + fVar26 * local_a8 + fVar3 * local_128 + fVar18 * local_1a8;
        auVar52._4_4_ =
             fVar30 * fStack_24 + fVar71 * fStack_a4 + fVar10 * fStack_124 + fVar19 * fStack_1a4;
        auVar52._8_4_ =
             fVar31 * fStack_20 + fVar74 * fStack_a0 + fVar11 * fStack_120 + fVar20 * fStack_1a0;
        auVar52._12_4_ =
             fVar32 * fStack_1c + fVar75 * fStack_9c + fVar12 * fStack_11c + fVar21 * fStack_19c;
        auVar52._16_4_ =
             fVar33 * local_28 + fVar76 * local_a8 + fVar13 * local_128 + fVar22 * local_1a8;
        auVar52._20_4_ =
             fVar34 * fStack_24 + fVar27 * fStack_a4 + fVar16 * fStack_124 + fVar23 * fStack_1a4;
        auVar52._24_4_ =
             fVar35 * fStack_20 + fVar28 * fStack_a0 + fVar17 * fStack_120 + fVar24 * fStack_1a0;
        auVar52._28_4_ = fVar80 + fVar25 + fVar69 + auVar54._28_4_;
        local_48 = auVar57._0_4_;
        fStack_44 = auVar57._4_4_;
        fStack_40 = auVar57._8_4_;
        fStack_3c = auVar57._12_4_;
        auVar58._0_4_ =
             fVar29 * local_48 + fVar26 * local_c8 + fVar3 * local_148 + fVar18 * local_1c8;
        auVar58._4_4_ =
             fVar30 * fStack_44 + fVar71 * fStack_c4 + fVar10 * fStack_144 + fVar19 * fStack_1c4;
        auVar58._8_4_ =
             fVar31 * fStack_40 + fVar74 * fStack_c0 + fVar11 * fStack_140 + fVar20 * fStack_1c0;
        auVar58._12_4_ =
             fVar32 * fStack_3c + fVar75 * fStack_bc + fVar12 * fStack_13c + fVar21 * fStack_1bc;
        auVar58._16_4_ =
             fVar33 * local_48 + fVar76 * local_c8 + fVar13 * local_148 + fVar22 * local_1c8;
        auVar58._20_4_ =
             fVar34 * fStack_44 + fVar27 * fStack_c4 + fVar16 * fStack_144 + fVar23 * fStack_1c4;
        auVar58._24_4_ =
             fVar35 * fStack_40 + fVar28 * fStack_c0 + fVar17 * fStack_140 + fVar24 * fStack_1c0;
        auVar58._28_4_ = fVar80 + fVar25 + fVar69 + auVar59._28_4_;
        auVar59 = ZEXT3264(auVar58);
        auVar53 = vminps_avx(auVar70,auVar52);
        auVar70 = vblendvps_avx(auVar53,auVar70,auVar78);
        local_68 = auVar46._0_4_;
        fStack_64 = auVar46._4_4_;
        fStack_60 = auVar46._8_4_;
        fStack_5c = auVar46._12_4_;
        auVar62._0_4_ =
             fVar29 * local_68 + fVar26 * local_e8 + fVar3 * local_168 + fVar18 * local_1e8;
        auVar62._4_4_ =
             fVar30 * fStack_64 + fVar71 * fStack_e4 + fVar10 * fStack_164 + fVar19 * fStack_1e4;
        auVar62._8_4_ =
             fVar31 * fStack_60 + fVar74 * fStack_e0 + fVar11 * fStack_160 + fVar20 * fStack_1e0;
        auVar62._12_4_ =
             fVar32 * fStack_5c + fVar75 * fStack_dc + fVar12 * fStack_15c + fVar21 * fStack_1dc;
        auVar62._16_4_ =
             fVar33 * local_68 + fVar76 * local_e8 + fVar13 * local_168 + fVar22 * local_1e8;
        auVar62._20_4_ =
             fVar34 * fStack_64 + fVar27 * fStack_e4 + fVar16 * fStack_164 + fVar23 * fStack_1e4;
        auVar62._24_4_ =
             fVar35 * fStack_60 + fVar28 * fStack_e0 + fVar17 * fStack_160 + fVar24 * fStack_1e0;
        auVar62._28_4_ = auVar53._28_4_ + fVar25 + fVar69 + auVar63._28_4_;
        auVar63 = ZEXT3264(auVar62);
        auVar53 = vminps_avx(auVar72,auVar58);
        auVar72 = vblendvps_avx(auVar53,auVar72,auVar78);
        auVar53 = vminps_avx(auVar73,auVar62);
        auVar73 = vblendvps_avx(auVar53,auVar73,auVar78);
        local_88 = auVar42._0_4_;
        fStack_84 = auVar42._4_4_;
        fStack_80 = auVar42._8_4_;
        fStack_7c = auVar42._12_4_;
        auVar67._0_4_ =
             fVar29 * local_88 + fVar3 * local_188 + auVar15._0_4_ * fVar18 + fVar26 * local_108;
        auVar67._4_4_ =
             fVar30 * fStack_84 + fVar10 * fStack_184 + auVar15._4_4_ * fVar19 + fVar71 * fStack_104
        ;
        auVar67._8_4_ =
             fVar31 * fStack_80 + fVar11 * fStack_180 + auVar15._8_4_ * fVar20 + fVar74 * fStack_100
        ;
        auVar67._12_4_ =
             fVar32 * fStack_7c + fVar12 * fStack_17c + auVar15._12_4_ * fVar21 + fVar75 * fStack_fc
        ;
        auVar67._16_4_ =
             fVar33 * local_88 + fVar13 * local_188 + auVar15._0_4_ * fVar22 + fVar76 * local_108;
        auVar67._20_4_ =
             fVar34 * fStack_84 + fVar16 * fStack_184 + auVar15._4_4_ * fVar23 + fVar27 * fStack_104
        ;
        auVar67._24_4_ =
             fVar35 * fStack_80 + fVar17 * fStack_180 + auVar15._8_4_ * fVar24 + fVar28 * fStack_100
        ;
        auVar67._28_4_ = auVar53._28_4_ + fVar80 + pfVar2[7];
        auVar68 = ZEXT3264(auVar67);
        auVar53 = vmaxps_avx(auVar79,auVar52);
        auVar79 = vblendvps_avx(auVar53,auVar79,auVar78);
        auVar53 = vmaxps_avx(auVar77,auVar58);
        auVar77 = vblendvps_avx(auVar53,auVar77,auVar78);
        auVar53 = vmaxps_avx(auVar56,auVar62);
        auVar56 = vblendvps_avx(auVar53,auVar56,auVar78);
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar53._16_4_ = 0x7fffffff;
        auVar53._20_4_ = 0x7fffffff;
        auVar53._24_4_ = 0x7fffffff;
        auVar53._28_4_ = 0x7fffffff;
        auVar53 = vandps_avx(auVar67,auVar53);
        auVar53 = vmaxps_avx(auVar44._0_32_,auVar53);
        auVar54 = ZEXT3264(auVar53);
        auVar53 = vblendvps_avx(auVar53,auVar44._0_32_,auVar78);
        auVar44 = ZEXT3264(auVar53);
        uVar37 = uVar37 + 8;
      } while (uVar37 <= uVar36);
    }
    auVar52 = vshufps_avx(auVar70,auVar70,0xb1);
    auVar70 = vminps_avx(auVar70,auVar52);
    auVar52 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vminps_avx(auVar70,auVar52);
    auVar42 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar70 = vshufps_avx(auVar72,auVar72,0xb1);
    auVar70 = vminps_avx(auVar72,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vminps_avx(auVar70,auVar72);
    auVar49 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar49 = vunpcklps_avx(auVar42,auVar49);
    auVar70 = vshufps_avx(auVar73,auVar73,0xb1);
    auVar70 = vminps_avx(auVar73,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vminps_avx(auVar70,auVar72);
    auVar42 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar42 = vinsertps_avx(auVar49,auVar42,0x28);
    auVar70 = vshufps_avx(auVar79,auVar79,0xb1);
    auVar70 = vmaxps_avx(auVar79,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vmaxps_avx(auVar70,auVar72);
    auVar49 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar70 = vshufps_avx(auVar77,auVar77,0xb1);
    auVar70 = vmaxps_avx(auVar77,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vmaxps_avx(auVar70,auVar72);
    auVar41 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar41 = vunpcklps_avx(auVar49,auVar41);
    auVar70 = vshufps_avx(auVar56,auVar56,0xb1);
    auVar70 = vmaxps_avx(auVar56,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vmaxps_avx(auVar70,auVar72);
    auVar49 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar49 = vinsertps_avx(auVar41,auVar49,0x28);
    auVar70 = vshufps_avx(auVar53,auVar53,0xb1);
    auVar70 = vmaxps_avx(auVar53,auVar70);
    auVar72 = vshufpd_avx(auVar70,auVar70,5);
    auVar70 = vmaxps_avx(auVar70,auVar72);
    auVar41 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
    auVar41 = vshufps_avx(auVar41,auVar41,0);
    auVar42 = vsubps_avx(auVar42,auVar41);
    auVar45._0_4_ = auVar49._0_4_ + auVar41._0_4_;
    auVar45._4_4_ = auVar49._4_4_ + auVar41._4_4_;
    auVar45._8_4_ = auVar49._8_4_ + auVar41._8_4_;
    auVar45._12_4_ = auVar49._12_4_ + auVar41._12_4_;
  }
  auVar48._8_4_ = 0x7fffffff;
  auVar48._0_8_ = 0x7fffffff7fffffff;
  auVar48._12_4_ = 0x7fffffff;
  auVar49 = vandps_avx(auVar42,auVar48);
  auVar41 = vandps_avx(auVar45,auVar48);
  auVar49 = vmaxps_avx(auVar49,auVar41);
  auVar41 = vmovshdup_avx(auVar49);
  auVar41 = vmaxss_avx(auVar41,auVar49);
  auVar49 = vshufpd_avx(auVar49,auVar49,1);
  auVar49 = vmaxss_avx(auVar49,auVar41);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ * 4.7683716e-07));
  auVar49 = vshufps_avx(auVar49,auVar49,0);
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar42,auVar49);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar45._0_4_ + auVar49._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar45._4_4_ + auVar49._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar45._8_4_ + auVar49._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar45._12_4_ + auVar49._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }